

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool wabt::anon_unknown_1::IsInstr(TokenTypePair pair)

{
  bool bVar1;
  reference pvVar2;
  bool local_19;
  array<wabt::TokenType,_2UL> local_10;
  TokenTypePair pair_local;
  
  local_10._M_elems = pair._M_elems;
  pvVar2 = std::array<wabt::TokenType,_2UL>::operator[](&local_10,0);
  bVar1 = IsPlainOrBlockInstr(*pvVar2);
  local_19 = true;
  if (!bVar1) {
    local_19 = IsExpr((TokenTypePair)local_10._M_elems);
  }
  return local_19;
}

Assistant:

bool IsInstr(TokenTypePair pair) {
  return IsPlainOrBlockInstr(pair[0]) || IsExpr(pair);
}